

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void add_reg_to_rw_list(MCInst *MI,m680x_reg reg,e_access access)

{
  undefined1 uVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined2 uVar7;
  long lVar8;
  
  if (reg == M680X_REG_INVALID || MI == (MCInst *)0x0) {
    return;
  }
  uVar7 = (undefined2)reg;
  if (access == READ) {
    uVar1 = (undefined1)MI->Operands[1].MachineOperandType;
    uVar5 = (ulong)(byte)uVar1;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      if ((short)MI->OpcodePub == uVar7) {
        return;
      }
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        if (uVar5 == uVar6) break;
        uVar3 = uVar6 + 1;
      } while (*(short *)((long)&((MCInst *)(MI->Operands + -1))->OpcodePub + uVar6 * 2) != uVar7);
      if (uVar6 < uVar5) {
        return;
      }
    }
    *(undefined1 *)&MI->Operands[1].MachineOperandType = uVar1 + kRegister;
    *(undefined2 *)((long)&((MCInst *)(MI->Operands + -1))->OpcodePub + uVar5 * 2) = uVar7;
    return;
  }
  if (access != WRITE) {
    if (access != MODIFY) {
      return;
    }
    uVar1 = (undefined1)MI->Operands[1].MachineOperandType;
    uVar5 = (ulong)(byte)uVar1;
    if (uVar5 == 0) {
      uVar5 = 0;
LAB_0025a45b:
      *(undefined1 *)&MI->Operands[1].MachineOperandType = uVar1 + kRegister;
      *(undefined2 *)((long)&((MCInst *)(MI->Operands + -1))->OpcodePub + uVar5 * 2) = uVar7;
    }
    else if ((short)MI->OpcodePub != uVar7) {
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        if (uVar5 == uVar6) break;
        uVar3 = uVar6 + 1;
      } while (*(short *)((long)&((MCInst *)(MI->Operands + -1))->OpcodePub + uVar6 * 2) != uVar7);
      if (uVar5 <= uVar6) goto LAB_0025a45b;
    }
  }
  bVar2 = *(byte *)((long)&MI->Operands[3].field_2 + 2);
  uVar5 = (ulong)bVar2;
  if (uVar5 != 0) {
    if (*(undefined2 *)((long)&MI->Operands[1].MachineOperandType + 2) != uVar7) {
      lVar4 = 0;
      do {
        lVar8 = lVar4;
        if (uVar5 - 1 == lVar8) break;
        lVar4 = lVar8 + 1;
      } while (*(undefined2 *)(&MI->Operands[1].Kind + lVar8 * 2) != uVar7);
      if (uVar5 <= lVar8 + 1U) goto LAB_0025a4a4;
    }
    return;
  }
  uVar5 = 0;
LAB_0025a4a4:
  *(byte *)((long)&MI->Operands[3].field_2 + 2) = bVar2 + 1;
  *(undefined2 *)((long)&MI->Operands[1].MachineOperandType + uVar5 * 2 + 2) = uVar7;
  return;
}

Assistant:

static void add_reg_to_rw_list(m68k_info *info, m68k_reg reg, int write)
{
	if (reg == M68K_REG_INVALID)
		return;

	if (write)
	{
		if (exists_reg_list(info->regs_write, info->regs_write_count, reg))
			return;

		info->regs_write[info->regs_write_count] = (uint16_t)reg;
		info->regs_write_count++;
	}
	else
	{
		if (exists_reg_list(info->regs_read, info->regs_read_count, reg))
			return;

		info->regs_read[info->regs_read_count] = (uint16_t)reg;
		info->regs_read_count++;
	}
}